

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,StringTree *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6)

{
  size_t sVar1;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *pos;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_a0;
  StringTree *local_88;
  ArrayPtr<const_char> *local_80;
  StringTree *local_78;
  StringTree *local_70;
  char *local_68;
  size_t sStack_60;
  char *local_58;
  char *local_50;
  size_t sStack_48;
  size_t local_40;
  size_t sStack_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_68 = (this->text).content.ptr;
  sStack_60 = params->size_;
  local_58 = params_1->ptr;
  local_50 = (params_2->text).content.ptr;
  sStack_48 = params_3->size_;
  local_40 = params_4->size_;
  sStack_38 = params_5->size_;
  nums._M_len = (size_type)params_4;
  nums._M_array = (iterator)0x7;
  local_78 = (StringTree *)params_1;
  sVar1 = _::sum((_ *)&local_68,nums);
  __return_storage_ptr__->size_ = sVar1;
  local_68 = (this->text).content.ptr;
  sStack_60 = params->size_;
  local_58 = (char *)0x0;
  local_50 = (params_2->text).content.ptr;
  sStack_48 = params_3->size_;
  local_40 = params_4->size_;
  sStack_38 = params_5->size_;
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0x7;
  local_88 = this;
  local_80 = params;
  local_70 = params_2;
  sVar1 = _::sum((_ *)&local_68,nums_00);
  heapString((String *)&local_a0,sVar1);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_a0);
  Array<char>::~Array((Array<char> *)&local_a0);
  local_68 = (char *)0x0;
  sStack_60 = 0;
  local_58 = (char *)0x1;
  local_50 = (char *)0x0;
  sStack_48 = 0;
  local_40 = 0;
  sStack_38 = 0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0x7;
  sVar1 = _::sum((_ *)&local_68,nums_01);
  local_a0.ptr = _::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar1);
  local_a0.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_a0.size_ = sVar1;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_a0);
  Array<kj::StringTree::Branch>::~Array(&local_a0);
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,(ArrayPtr<const_char> *)local_88,local_80,local_78,
             (ArrayPtr<const_char> *)local_70,params_3,params_4,params_5);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}